

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msc.h
# Opt level: O1

vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> * __thiscall
msc::
cluster_shifted<double,__gnu_cxx::__normal_iterator<std::vector<double,std::allocator<double>>const*,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>,msc::metrics::L2Sq>
          (double param_1,
          vector<msc::Cluster<double>,std::allocator<msc::Cluster<double>>> *__return_storage_ptr__,
          msc *this,msc *first,uint param_5)

{
  long lVar1;
  iterator __position;
  long lVar2;
  invalid_argument *this_00;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  it;
  double dVar7;
  double dVar8;
  double *pt;
  uint local_4c;
  unsigned_long local_48;
  double local_40;
  double *local_38;
  
  local_4c = param_5;
  local_40 = param_1;
  if (0 < (int)param_5) {
    *(undefined8 *)__return_storage_ptr__ = 0;
    *(undefined8 *)(__return_storage_ptr__ + 8) = 0;
    *(undefined8 *)(__return_storage_ptr__ + 0x10) = 0;
    local_48 = 0;
    if (this != first) {
      do {
        local_38 = *(double **)this;
        lVar1 = *(long *)__return_storage_ptr__;
        lVar2 = (*(long *)(__return_storage_ptr__ + 8) - lVar1 >> 4) * -0x5555555555555555;
        if (*(long *)(__return_storage_ptr__ + 8) == lVar1) {
          lVar6 = 0;
        }
        else {
          lVar3 = lVar2 + (ulong)(lVar2 == 0);
          lVar5 = 0;
          do {
            if ((int)local_4c < 1) {
              dVar7 = 0.0;
            }
            else {
              dVar7 = 0.0;
              uVar4 = 0;
              do {
                dVar8 = local_38[uVar4] - *(double *)(*(long *)(lVar1 + lVar5 * 0x30) + uVar4 * 8);
                dVar7 = dVar7 + dVar8 * dVar8;
                uVar4 = uVar4 + 1;
              } while (local_4c != uVar4);
            }
            lVar6 = lVar5;
          } while ((local_40 < dVar7) && (lVar5 = lVar5 + 1, lVar6 = lVar3, lVar5 != lVar3));
        }
        if (lVar6 == lVar2) {
          std::vector<msc::Cluster<double>,std::allocator<msc::Cluster<double>>>::
          emplace_back<double_const*&,int&>(__return_storage_ptr__,&local_38,(int *)&local_4c);
        }
        lVar1 = *(long *)__return_storage_ptr__ + lVar6 * 0x30;
        __position._M_current = *(unsigned_long **)(lVar1 + 0x20);
        if (__position._M_current == *(unsigned_long **)(lVar1 + 0x28)) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)(lVar1 + 0x18),
                     __position,&local_48);
        }
        else {
          *__position._M_current = local_48;
          *(unsigned_long **)(lVar1 + 0x20) = __position._M_current + 1;
        }
        this = this + 0x18;
        local_48 = local_48 + 1;
      } while (this != first);
    }
    return (vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> *)
           __return_storage_ptr__;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Dimension must be greater than 0");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline std::vector<Cluster<T>> cluster_shifted(
    InputIterator first, InputIterator last, int dim, Metric metric,
    double epsilon = std::numeric_limits<float>::epsilon())
{
    if (dim <= 0)
        throw std::invalid_argument("Dimension must be greater than 0");
    typedef typename std::iterator_traits<InputIterator>::value_type C;
    std::vector<Cluster<T>> clusters;
    std::size_t i = 0;
    for (auto it = first; it != last; it++, i++)
    {
        const T* pt = Accessor<T, C>::data(*it);
        std::size_t c = 0;
        for (; c < clusters.size(); c++)
            if (metric(pt, clusters[c].mode.data(), dim) <= epsilon)
                break;
        if (c == clusters.size())
            clusters.emplace_back(pt, dim);
        clusters[c].members.emplace_back(i);
    }

    return clusters;
}